

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall flatbuffers::FlatBufferBuilderImpl<false>::Clear(FlatBufferBuilderImpl<false> *this)

{
  FlatBufferBuilderImpl<false> *this_local;
  
  ClearOffsets(this);
  vector_downward<unsigned_int>::clear(&this->buf_);
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->length_of_64_bit_region_ = 0;
  if (this->string_pool != (StringOffsetMap *)0x0) {
    std::
    set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::clear(this->string_pool);
  }
  return;
}

Assistant:

void Clear() {
    ClearOffsets();
    buf_.clear();
    nested = false;
    finished = false;
    minalign_ = 1;
    length_of_64_bit_region_ = 0;
    if (string_pool) string_pool->clear();
  }